

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::findOrCreateLightSource(SemanticParser *this,SP *in)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  mapped_type *pmVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  *this_00;
  SP SVar5;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (((__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
      &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr == (element_type *)0x0) {
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
               *)(in + 5);
    p_Var4 = in_RDX._M_pi;
    pmVar3 = std::
             map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
             ::operator[](this_00,(key_type *)in_RDX._M_pi);
    if ((pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      local_28 = ((__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
                 &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
      local_20._M_pi =
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RDX._M_pi)->_M_use_count)->_M_pi;
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        }
      }
      createLightSourceFrom((SemanticParser *)&stack0xffffffffffffffc8,(SP *)p_Var4);
      pmVar3 = std::
               map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
               ::operator[](this_00,(key_type *)in_RDX._M_pi);
      _Var2._M_pi = _Stack_30._M_pi;
      peVar1 = local_38;
      local_38 = (element_type *)0x0;
      _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)peVar1;
      (pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Var2._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
      }
    }
    pmVar3 = std::
             map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
             ::operator[](this_00,(key_type *)in_RDX._M_pi);
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (pmVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var4;
    in_RDX._M_pi = extraout_RDX;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
  }
  SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::findOrCreateLightSource(pbrt::syntactic::LightSource::SP in)
  {
    if (!in)
      return LightSource::SP();

    if (!lightSourceMapping[in]) {
      lightSourceMapping[in] = createLightSourceFrom(in);
    }
    return lightSourceMapping[in];
  }